

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ushort uVar12;
  ushort uVar13;
  BVH *bvh;
  size_t sVar14;
  Geometry *pGVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [12];
  byte bVar41;
  byte bVar42;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  long lVar46;
  byte bVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  NodeRef root;
  size_t sVar51;
  ulong uVar52;
  uint uVar53;
  ulong uVar54;
  byte bVar55;
  long lVar56;
  uint uVar57;
  uint uVar58;
  NodeRef *pNVar59;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar60;
  undefined4 uVar61;
  ulong uVar62;
  ushort uVar63;
  float *pfVar64;
  bool bVar65;
  ulong uVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  vint4 ai_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  vint4 bi;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar121;
  float fVar122;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  vint4 ai;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  vint4 ai_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  vint4 ai_3;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  uint uVar151;
  uint uVar152;
  uint uVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar162 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar163 [64];
  Precalculations pre;
  vfloat<4> upper_y;
  undefined1 local_1b28 [8];
  float fStack_1b20;
  float fStack_1b1c;
  vfloat<4> lower_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1a58;
  undefined1 local_1a48 [16];
  vfloat<4> upper_x;
  TravRayK<4,_false> tray;
  vfloat<4> lower_x;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar70 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar73 = ZEXT816(0) << 0x40;
    uVar23 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar73,5);
    uVar66 = vpcmpeqd_avx512vl(auVar70,(undefined1  [16])valid_i->field_0);
    uVar66 = ((byte)uVar23 & 0xf) & uVar66;
    bVar42 = (byte)uVar66;
    if (bVar42 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar70 = vandps_avx(auVar72,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar68._8_4_ = 0x219392ef;
      auVar68._0_8_ = 0x219392ef219392ef;
      auVar68._12_4_ = 0x219392ef;
      uVar67 = vcmpps_avx512vl(auVar70,auVar68,1);
      bVar65 = (bool)((byte)uVar67 & 1);
      auVar69._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._0_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._4_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._8_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._12_4_;
      auVar70 = vandps_avx(auVar72,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar67 = vcmpps_avx512vl(auVar70,auVar68,1);
      bVar65 = (bool)((byte)uVar67 & 1);
      auVar90._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._16_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar90._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._20_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar90._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._24_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar90._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._28_4_;
      auVar70 = vandps_avx(auVar72,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar67 = vcmpps_avx512vl(auVar70,auVar68,1);
      bVar65 = (bool)((byte)uVar67 & 1);
      auVar89._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._32_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar89._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._36_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar89._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._40_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar89._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * tray.dir.field_0._44_4_;
      auVar68 = vrcp14ps_avx512vl(auVar69);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = &DAT_3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar70 = vfnmadd213ps_fma(auVar69,auVar68,auVar71);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar70,auVar68,auVar68)
      ;
      auVar69 = vrcp14ps_avx512vl(auVar90);
      auVar70 = vfnmadd213ps_fma(auVar90,auVar69,auVar71);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar70,auVar69,auVar69)
      ;
      auVar69 = vrcp14ps_avx512vl(auVar89);
      auVar70 = vfnmadd213ps_fma(auVar89,auVar69,auVar71);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar70,auVar69,auVar69)
      ;
      uVar67 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar73,1);
      auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar67 >> 1) & 1) * auVar70._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar67 & 1) * auVar70._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar67 >> 2) & 1) * auVar70._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar67 >> 3) & 1) * auVar70._12_4_;
      uVar67 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar73,5);
      auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar65 = (bool)((byte)uVar67 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar65 * auVar70._0_4_ | (uint)!bVar65 * 0x30;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar65 * auVar70._4_4_ | (uint)!bVar65 * 0x30;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar65 * auVar70._8_4_ | (uint)!bVar65 * 0x30;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar65 * auVar70._12_4_ | (uint)!bVar65 * 0x30;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar67 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar73,5);
      auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar65 = (bool)((byte)uVar67 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar65 * auVar70._0_4_ | (uint)!bVar65 * 0x50;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar65 * auVar70._4_4_ | (uint)!bVar65 * 0x50;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar65 * auVar70._8_4_ | (uint)!bVar65 * 0x50;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar65 * auVar70._12_4_ | (uint)!bVar65 * 0x50;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar160 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar70 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar73);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar42 & 1) * auVar70._0_4_ |
           (uint)!(bool)(bVar42 & 1) * stack_near[0].field_0._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar65 * auVar70._4_4_ | (uint)!bVar65 * stack_near[0].field_0._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar65 * auVar70._8_4_ | (uint)!bVar65 * stack_near[0].field_0._8_4_;
      bVar65 = SUB81(uVar66 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar65 * auVar70._12_4_ | (uint)!bVar65 * stack_near[0].field_0._12_4_;
      auVar70 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar73);
      tray.tfar.field_0.i[0] =
           (uint)(bVar42 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar42 & 1) * -0x800000;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar65 * auVar70._4_4_ | (uint)!bVar65 * -0x800000;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar65 * auVar70._8_4_ | (uint)!bVar65 * -0x800000;
      bVar65 = SUB81(uVar66 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar65 * auVar70._12_4_ | (uint)!bVar65 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar53 = 3;
      }
      else {
        uVar53 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      uVar63 = (ushort)uVar66 ^ 0xf;
      pNVar59 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar60 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar161 = ZEXT1664(auVar70);
      auVar70 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar162 = ZEXT1664(auVar70);
      do {
        paVar60 = paVar60 + -1;
        root.ptr = pNVar59[-1].ptr;
        pNVar59 = pNVar59 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0074f7d1:
          iVar44 = 3;
        }
        else {
          aVar81 = *paVar60;
          uVar66 = vcmpps_avx512vl((undefined1  [16])aVar81,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar66 == '\0') {
LAB_0074f806:
            iVar44 = 2;
          }
          else {
            uVar61 = (undefined4)uVar66;
            iVar44 = 0;
            if ((uint)POPCOUNT(uVar61) <= uVar53) {
              do {
                sVar51 = 0;
                for (uVar67 = uVar66; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000)
                {
                  sVar51 = sVar51 + 1;
                }
                bVar65 = occluded1(This,bvh,root,sVar51,&pre,ray,&tray,context);
                bVar55 = (byte)(1 << ((uint)sVar51 & 0x1f));
                if (!bVar65) {
                  bVar55 = 0;
                }
                bVar55 = (byte)uVar63 | bVar55;
                uVar63 = (ushort)bVar55;
                uVar66 = uVar66 - 1 & uVar66;
              } while (uVar66 != 0);
              uVar63 = (ushort)bVar55;
              if (bVar55 == 0xf) {
                iVar44 = 3;
              }
              else {
                auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar55 & 1) * auVar70._0_4_ |
                     (uint)!(bool)(bVar55 & 1) * tray.tfar.field_0.i[0];
                bVar65 = (bool)(bVar55 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar65 * auVar70._4_4_ | (uint)!bVar65 * tray.tfar.field_0.i[1];
                bVar65 = (bool)(bVar55 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar65 * auVar70._8_4_ | (uint)!bVar65 * tray.tfar.field_0.i[2];
                bVar65 = (bool)(bVar55 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar65 * auVar70._12_4_ | (uint)!bVar65 * tray.tfar.field_0.i[3];
                iVar44 = 2;
              }
              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar160 = ZEXT1664(auVar70);
              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar161 = ZEXT1664(auVar70);
              auVar70 = vxorps_avx512vl(auVar162._0_16_,auVar162._0_16_);
              auVar162 = ZEXT1664(auVar70);
              in_ZMM22 = ZEXT1664(in_ZMM22._0_16_);
              in_ZMM23 = ZEXT1664(in_ZMM23._0_16_);
              in_ZMM24 = ZEXT1664(in_ZMM24._0_16_);
            }
            auVar147 = ZEXT1664((undefined1  [16])aVar81);
            if (uVar53 < (uint)POPCOUNT(uVar61)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0074f7d1;
                  uVar23 = vcmpps_avx512vl(auVar147._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar23 != '\0') {
                    uVar66 = (ulong)((uint)root.ptr & 0xf);
                    bVar55 = (byte)uVar63 & 0xf;
                    if (uVar66 != 8) {
                      uVar67 = root.ptr & 0xfffffffffffffff0;
                      bVar55 = bVar55 ^ 0xf;
                      lVar46 = 0;
                      do {
                        lVar49 = lVar46 * 0x58;
                        auVar70._8_8_ = 0;
                        auVar70._0_8_ = *(ulong *)(uVar67 + 0x20 + lVar49);
                        auVar73._8_8_ = 0;
                        auVar73._0_8_ = *(ulong *)(uVar67 + 0x24 + lVar49);
                        uVar52 = vpcmpub_avx512vl(auVar70,auVar73,2);
                        if ((uVar52 & 0xf) != 0) {
                          lVar49 = lVar49 + uVar67;
                          uVar52 = (ulong)((byte)uVar52 & 0xf);
                          do {
                            lVar25 = 0;
                            for (uVar45 = uVar52; (uVar45 & 1) == 0;
                                uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                              lVar25 = lVar25 + 1;
                            }
                            auVar77._8_8_ = 0;
                            auVar77._0_8_ = *(ulong *)(lVar49 + 0x20);
                            auVar70 = vpmovzxbd_avx(auVar77);
                            auVar70 = vcvtdq2ps_avx(auVar70);
                            uVar61 = *(undefined4 *)(lVar49 + 0x44);
                            auVar106._4_4_ = uVar61;
                            auVar106._0_4_ = uVar61;
                            auVar106._8_4_ = uVar61;
                            auVar106._12_4_ = uVar61;
                            uVar61 = *(undefined4 *)(lVar49 + 0x38);
                            auVar114._4_4_ = uVar61;
                            auVar114._0_4_ = uVar61;
                            auVar114._8_4_ = uVar61;
                            auVar114._12_4_ = uVar61;
                            lower_x.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmadd213ps_fma(auVar70,auVar106,auVar114);
                            auVar78._8_8_ = 0;
                            auVar78._0_8_ = *(ulong *)(lVar49 + 0x24);
                            auVar70 = vpmovzxbd_avx(auVar78);
                            auVar70 = vcvtdq2ps_avx(auVar70);
                            upper_x.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmadd213ps_fma(auVar70,auVar106,auVar114);
                            auVar79._8_8_ = 0;
                            auVar79._0_8_ = *(ulong *)(lVar49 + 0x28);
                            auVar70 = vpmovzxbd_avx(auVar79);
                            auVar70 = vcvtdq2ps_avx(auVar70);
                            uVar61 = *(undefined4 *)(lVar49 + 0x48);
                            auVar107._4_4_ = uVar61;
                            auVar107._0_4_ = uVar61;
                            auVar107._8_4_ = uVar61;
                            auVar107._12_4_ = uVar61;
                            uVar61 = *(undefined4 *)(lVar49 + 0x3c);
                            auVar115._4_4_ = uVar61;
                            auVar115._0_4_ = uVar61;
                            auVar115._8_4_ = uVar61;
                            auVar115._12_4_ = uVar61;
                            lower_y.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmadd213ps_fma(auVar70,auVar107,auVar115);
                            auVar80._8_8_ = 0;
                            auVar80._0_8_ = *(ulong *)(lVar49 + 0x2c);
                            auVar70 = vpmovzxbd_avx(auVar80);
                            auVar70 = vcvtdq2ps_avx(auVar70);
                            upper_y.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmadd213ps_fma(auVar70,auVar107,auVar115);
                            auVar82._8_8_ = 0;
                            auVar82._0_8_ = *(ulong *)(lVar49 + 0x30);
                            auVar70 = vpmovzxbd_avx(auVar82);
                            auVar70 = vcvtdq2ps_avx(auVar70);
                            uVar61 = *(undefined4 *)(lVar49 + 0x4c);
                            auVar108._4_4_ = uVar61;
                            auVar108._0_4_ = uVar61;
                            auVar108._8_4_ = uVar61;
                            auVar108._12_4_ = uVar61;
                            uVar61 = *(undefined4 *)(lVar49 + 0x40);
                            auVar116._4_4_ = uVar61;
                            auVar116._0_4_ = uVar61;
                            auVar116._8_4_ = uVar61;
                            auVar116._12_4_ = uVar61;
                            lower_z.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmadd213ps_fma(auVar70,auVar108,auVar116);
                            auVar98._8_8_ = 0;
                            auVar98._0_8_ = *(ulong *)(lVar49 + 0x34);
                            auVar70 = vpmovzxbd_avx(auVar98);
                            auVar70 = vcvtdq2ps_avx(auVar70);
                            upper_z.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmadd213ps_fma(auVar70,auVar108,auVar116);
                            auVar75._4_4_ = tray.org_rdir.field_0._4_4_;
                            auVar75._0_4_ = tray.org_rdir.field_0._0_4_;
                            auVar75._8_4_ = tray.org_rdir.field_0._8_4_;
                            auVar75._12_4_ = tray.org_rdir.field_0._12_4_;
                            uVar45 = (ulong)(uint)((int)lVar25 * 4);
                            uVar61 = *(undefined4 *)((long)&lower_x.field_0 + uVar45);
                            auVar127._4_4_ = uVar61;
                            auVar127._0_4_ = uVar61;
                            auVar127._8_4_ = uVar61;
                            auVar127._12_4_ = uVar61;
                            auVar69 = vfmsub132ps_fma(auVar127,auVar75,
                                                      (undefined1  [16])
                                                      tray.rdir.field_0.field_0.x.field_0);
                            uVar61 = *(undefined4 *)((long)&lower_y.field_0 + uVar45);
                            auVar134._4_4_ = uVar61;
                            auVar134._0_4_ = uVar61;
                            auVar134._8_4_ = uVar61;
                            auVar134._12_4_ = uVar61;
                            auVar76._4_4_ = tray.org_rdir.field_0._36_4_;
                            auVar76._0_4_ = tray.org_rdir.field_0._32_4_;
                            auVar76._8_4_ = tray.org_rdir.field_0._40_4_;
                            auVar76._12_4_ = tray.org_rdir.field_0._44_4_;
                            uVar61 = *(undefined4 *)((long)&lower_z.field_0 + uVar45);
                            auVar142._4_4_ = uVar61;
                            auVar142._0_4_ = uVar61;
                            auVar142._8_4_ = uVar61;
                            auVar142._12_4_ = uVar61;
                            auVar90 = vfmsub132ps_fma(auVar134,(undefined1  [16])
                                                               tray.org_rdir.field_0.field_0.y.
                                                               field_0,
                                                      (undefined1  [16])
                                                      tray.rdir.field_0.field_0.y.field_0);
                            auVar89 = vfmsub132ps_fma(auVar142,auVar76,
                                                      (undefined1  [16])
                                                      tray.rdir.field_0.field_0.z.field_0);
                            uVar61 = *(undefined4 *)((long)&upper_x.field_0 + uVar45);
                            auVar87._4_4_ = uVar61;
                            auVar87._0_4_ = uVar61;
                            auVar87._8_4_ = uVar61;
                            auVar87._12_4_ = uVar61;
                            auVar68 = vfmsub132ps_avx512vl
                                                ((undefined1  [16])
                                                 tray.rdir.field_0.field_0.x.field_0,auVar75,auVar87
                                                );
                            uVar61 = *(undefined4 *)((long)&upper_y.field_0 + uVar45);
                            auVar88._4_4_ = uVar61;
                            auVar88._0_4_ = uVar61;
                            auVar88._8_4_ = uVar61;
                            auVar88._12_4_ = uVar61;
                            auVar71 = vfmsub132ps_avx512vl
                                                ((undefined1  [16])
                                                 tray.rdir.field_0.field_0.y.field_0,
                                                 (undefined1  [16])
                                                 tray.org_rdir.field_0.field_0.y.field_0,auVar88);
                            uVar61 = *(undefined4 *)((long)&upper_z.field_0 + uVar45);
                            auVar74._4_4_ = uVar61;
                            auVar74._0_4_ = uVar61;
                            auVar74._8_4_ = uVar61;
                            auVar74._12_4_ = uVar61;
                            auVar72 = vfmsub132ps_avx512vl
                                                ((undefined1  [16])
                                                 tray.rdir.field_0.field_0.z.field_0,auVar76,auVar74
                                                );
                            auVar70 = vpminsd_avx(auVar69,auVar68);
                            auVar73 = vpminsd_avx(auVar90,auVar71);
                            auVar70 = vpmaxsd_avx(auVar70,auVar73);
                            auVar73 = vpminsd_avx(auVar89,auVar72);
                            auVar70 = vpmaxsd_avx(auVar70,auVar73);
                            auVar73 = vpmaxsd_avx(auVar69,auVar68);
                            auVar69 = vpmaxsd_avx(auVar90,auVar71);
                            auVar69 = vpminsd_avx(auVar73,auVar69);
                            auVar73 = vpmaxsd_avx(auVar89,auVar72);
                            auVar73 = vpminsd_avx(auVar69,auVar73);
                            auVar70 = vpmaxsd_avx(auVar70,(undefined1  [16])tray.tnear.field_0);
                            auVar73 = vpminsd_avx(auVar73,(undefined1  [16])tray.tfar.field_0);
                            uVar23 = vpcmpd_avx512vl(auVar70,auVar73,2);
                            if ((bVar55 & (byte)uVar23 & 0xf) == 0) {
                              bVar65 = false;
                            }
                            else {
                              uVar12 = *(ushort *)(lVar49 + lVar25 * 8);
                              uVar13 = *(ushort *)(lVar49 + 2 + lVar25 * 8);
                              pGVar15 = (context->scene->geometries).items[*(uint *)(lVar49 + 0x50)]
                                        .ptr;
                              lVar16 = *(long *)&pGVar15->field_0x58;
                              lVar17 = *(long *)&pGVar15[1].time_range.upper;
                              lVar48 = (ulong)*(uint *)(lVar49 + 4 + lVar25 * 8) *
                                       pGVar15[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i;
                              uVar57 = uVar12 & 0x7fff;
                              uVar58 = uVar13 & 0x7fff;
                              uVar43 = *(uint *)(lVar16 + 4 + lVar48);
                              uVar54 = (ulong)uVar43;
                              uVar62 = (ulong)(uVar43 * uVar58 + *(int *)(lVar16 + lVar48) + uVar57)
                              ;
                              p_Var18 = pGVar15[1].intersectionFilterN;
                              puVar2 = (undefined8 *)(lVar17 + (uVar62 + 1) * (long)p_Var18);
                              lVar25 = uVar62 + uVar54;
                              lVar56 = uVar62 + uVar54 + 1;
                              puVar3 = (undefined8 *)(lVar17 + lVar25 * (long)p_Var18);
                              uStack_17a0 = puVar3[1];
                              puVar4 = (undefined8 *)(lVar17 + lVar56 * (long)p_Var18);
                              local_1768 = *puVar4;
                              uStack_1760 = puVar4[1];
                              uVar45 = (ulong)(-1 < (short)uVar12);
                              puVar4 = (undefined8 *)
                                       (lVar17 + (uVar62 + uVar45 + 1) * (long)p_Var18);
                              lVar50 = uVar45 + lVar56;
                              puVar5 = (undefined8 *)(lVar17 + lVar50 * (long)p_Var18);
                              local_1778 = *puVar5;
                              uStack_1770 = puVar5[1];
                              if ((short)uVar13 < 0) {
                                uVar54 = 0;
                              }
                              puVar5 = (undefined8 *)(lVar17 + (lVar25 + uVar54) * (long)p_Var18);
                              puVar6 = (undefined8 *)(lVar17 + (lVar56 + uVar54) * (long)p_Var18);
                              local_1738 = *puVar6;
                              uStack_1730 = puVar6[1];
                              puVar6 = (undefined8 *)(lVar17 + (uVar54 + lVar50) * (long)p_Var18);
                              auVar70 = vpbroadcastd_avx512vl();
                              auVar147 = ZEXT1664(auVar70);
                              lower_x.field_0 =
                                   *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                                    (lVar17 + (long)p_Var18 * uVar62);
                              local_1798 = *puVar2;
                              uStack_1790 = puVar2[1];
                              local_1788 = *puVar4;
                              uStack_1780 = puVar4[1];
                              local_1758 = *puVar3;
                              uStack_1750 = uStack_17a0;
                              local_1748 = local_1768;
                              uStack_1740 = uStack_1760;
                              local_1728 = *puVar5;
                              uStack_1720 = puVar5[1];
                              local_1718 = local_1768;
                              uStack_1710 = uStack_1760;
                              local_1708 = local_1778;
                              uStack_1700 = uStack_1770;
                              local_16f8 = *puVar6;
                              uStack_16f0 = puVar6[1];
                              local_16e8 = local_1738;
                              uStack_16e0 = uStack_1730;
                              auVar70 = vpbroadcastd_avx512vl();
                              auVar163 = ZEXT1664(auVar70);
                              pfVar64 = (float *)&uStack_17a0;
                              uVar45 = 0;
                              bVar47 = bVar55;
                              do {
                                fVar122 = pfVar64[-0xe];
                                auVar123._4_4_ = fVar122;
                                auVar123._0_4_ = fVar122;
                                auVar123._8_4_ = fVar122;
                                auVar123._12_4_ = fVar122;
                                fVar7 = pfVar64[-0xd];
                                auVar128._4_4_ = fVar7;
                                auVar128._0_4_ = fVar7;
                                auVar128._8_4_ = fVar7;
                                auVar128._12_4_ = fVar7;
                                fVar8 = pfVar64[-0xc];
                                auVar137._4_4_ = fVar8;
                                auVar137._0_4_ = fVar8;
                                auVar137._8_4_ = fVar8;
                                auVar137._12_4_ = fVar8;
                                auVar74 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-10]));
                                auVar75 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-9]));
                                local_1b28._4_4_ = pfVar64[-8];
                                auVar76 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-6]));
                                auVar77 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-5]));
                                auVar78 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-4]));
                                fVar9 = pfVar64[-2];
                                fVar10 = pfVar64[-1];
                                fVar11 = *pfVar64;
                                lower_z.field_0 =
                                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                     vmovdqa64_avx512vl(auVar163._0_16_);
                                auVar98 = auVar147._0_16_;
                                upper_z.field_0 =
                                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                     vmovdqa64_avx512vl(auVar98);
                                auVar70 = vsubss_avx512f(auVar123,auVar74);
                                fVar113 = auVar70._0_4_;
                                auVar130._4_4_ = fVar113;
                                auVar130._0_4_ = fVar113;
                                auVar130._8_4_ = fVar113;
                                auVar130._12_4_ = fVar113;
                                auVar70 = vsubss_avx512f(auVar128,auVar75);
                                fVar97 = auVar70._0_4_;
                                auVar143._4_4_ = fVar97;
                                auVar143._0_4_ = fVar97;
                                auVar143._8_4_ = fVar97;
                                auVar143._12_4_ = fVar97;
                                local_1b28._0_4_ = local_1b28._4_4_;
                                fStack_1b20 = (float)local_1b28._4_4_;
                                fStack_1b1c = (float)local_1b28._4_4_;
                                fVar22 = fVar8 - (float)local_1b28._4_4_;
                                auVar148._4_4_ = fVar22;
                                auVar148._0_4_ = fVar22;
                                auVar148._8_4_ = fVar22;
                                auVar148._12_4_ = fVar22;
                                fVar122 = fVar9 - fVar122;
                                auVar159._4_4_ = fVar122;
                                auVar159._0_4_ = fVar122;
                                auVar159._8_4_ = fVar122;
                                auVar159._12_4_ = fVar122;
                                auVar79 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar10 - fVar7)));
                                auVar80 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar11 - fVar8)));
                                fVar97 = (fVar11 - fVar8) * fVar97;
                                auVar99._4_4_ = fVar97;
                                auVar99._0_4_ = fVar97;
                                auVar99._8_4_ = fVar97;
                                auVar99._12_4_ = fVar97;
                                aVar81 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                         vfmsub231ps_avx512vl(auVar99,auVar79,auVar148);
                                fVar122 = fVar22 * fVar122;
                                auVar109._4_4_ = fVar122;
                                auVar109._0_4_ = fVar122;
                                auVar109._8_4_ = fVar122;
                                auVar109._12_4_ = fVar122;
                                auVar82 = vfmsub231ps_avx512vl(auVar109,auVar80,auVar130);
                                fVar113 = (fVar10 - fVar7) * fVar113;
                                auVar117._4_4_ = fVar113;
                                auVar117._0_4_ = fVar113;
                                auVar117._8_4_ = fVar113;
                                auVar117._12_4_ = fVar113;
                                auVar71 = vfmsub231ps_fma(auVar117,auVar159,auVar143);
                                auVar90 = vsubps_avx(auVar123,*(undefined1 (*) [16])ray);
                                auVar89 = vsubps_avx(auVar128,*(undefined1 (*) [16])(ray + 0x10));
                                auVar68 = vsubps_avx(auVar137,*(undefined1 (*) [16])(ray + 0x20));
                                auVar70 = *(undefined1 (*) [16])(ray + 0x40);
                                auVar73 = *(undefined1 (*) [16])(ray + 0x50);
                                auVar69 = *(undefined1 (*) [16])(ray + 0x60);
                                auVar154._0_4_ = auVar73._0_4_ * auVar68._0_4_;
                                auVar154._4_4_ = auVar73._4_4_ * auVar68._4_4_;
                                auVar154._8_4_ = auVar73._8_4_ * auVar68._8_4_;
                                auVar154._12_4_ = auVar73._12_4_ * auVar68._12_4_;
                                auVar72 = vfmsub231ps_fma(auVar154,auVar89,auVar69);
                                auVar155._0_4_ = auVar69._0_4_ * auVar90._0_4_;
                                auVar155._4_4_ = auVar69._4_4_ * auVar90._4_4_;
                                auVar155._8_4_ = auVar69._8_4_ * auVar90._8_4_;
                                auVar155._12_4_ = auVar69._12_4_ * auVar90._12_4_;
                                auVar87 = vfmsub231ps_fma(auVar155,auVar68,auVar70);
                                auVar157._0_4_ = auVar70._0_4_ * auVar89._0_4_;
                                auVar157._4_4_ = auVar70._4_4_ * auVar89._4_4_;
                                auVar157._8_4_ = auVar70._8_4_ * auVar89._8_4_;
                                auVar157._12_4_ = auVar70._12_4_ * auVar89._12_4_;
                                auVar88 = vfmsub231ps_fma(auVar157,auVar90,auVar73);
                                auVar138._0_4_ = auVar71._0_4_ * auVar69._0_4_;
                                auVar138._4_4_ = auVar71._4_4_ * auVar69._4_4_;
                                auVar138._8_4_ = auVar71._8_4_ * auVar69._8_4_;
                                auVar138._12_4_ = auVar71._12_4_ * auVar69._12_4_;
                                auVar73 = vfmadd231ps_fma(auVar138,auVar82,auVar73);
                                auVar70 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar81,auVar70);
                                auVar69 = vandps_avx512vl(auVar70,auVar161._0_16_);
                                auVar73 = vmulps_avx512vl(auVar80,auVar88);
                                auVar73 = vfmadd231ps_avx512vl(auVar73,auVar87,auVar79);
                                auVar73 = vfmadd231ps_fma(auVar73,auVar72,auVar159);
                                uVar43 = auVar69._0_4_;
                                auVar129._0_4_ = uVar43 ^ auVar73._0_4_;
                                uVar151 = auVar69._4_4_;
                                auVar129._4_4_ = uVar151 ^ auVar73._4_4_;
                                uVar152 = auVar69._8_4_;
                                auVar129._8_4_ = uVar152 ^ auVar73._8_4_;
                                uVar153 = auVar69._12_4_;
                                auVar129._12_4_ = uVar153 ^ auVar73._12_4_;
                                auVar73 = auVar162._0_16_;
                                uVar23 = vcmpps_avx512vl(auVar129,auVar73,5);
                                bVar41 = (byte)uVar23 & bVar47;
                                if (bVar41 == 0) {
LAB_0074ebac:
                                  uVar43 = 0;
                                }
                                else {
                                  auVar149._0_4_ = fVar22 * auVar88._0_4_;
                                  auVar149._4_4_ = fVar22 * auVar88._4_4_;
                                  auVar149._8_4_ = fVar22 * auVar88._8_4_;
                                  auVar149._12_4_ = fVar22 * auVar88._12_4_;
                                  auVar69 = vfmadd213ps_fma(auVar87,auVar143,auVar149);
                                  auVar69 = vfmadd213ps_fma(auVar72,auVar130,auVar69);
                                  auVar131._0_4_ = uVar43 ^ auVar69._0_4_;
                                  auVar131._4_4_ = uVar151 ^ auVar69._4_4_;
                                  auVar131._8_4_ = uVar152 ^ auVar69._8_4_;
                                  auVar131._12_4_ = uVar153 ^ auVar69._12_4_;
                                  uVar23 = vcmpps_avx512vl(auVar131,auVar73,5);
                                  bVar41 = bVar41 & (byte)uVar23;
                                  if (bVar41 == 0) goto LAB_0074ebac;
                                  auVar32._8_4_ = 0x7fffffff;
                                  auVar32._0_8_ = 0x7fffffff7fffffff;
                                  auVar32._12_4_ = 0x7fffffff;
                                  auVar72 = vandps_avx512vl(auVar70,auVar32);
                                  auVar69 = vsubps_avx(auVar72,auVar129);
                                  uVar23 = vcmpps_avx512vl(auVar69,auVar131,5);
                                  bVar41 = bVar41 & (byte)uVar23;
                                  if (bVar41 == 0) goto LAB_0074ebac;
                                  auVar145._0_4_ = auVar68._0_4_ * auVar71._0_4_;
                                  auVar145._4_4_ = auVar68._4_4_ * auVar71._4_4_;
                                  auVar145._8_4_ = auVar68._8_4_ * auVar71._8_4_;
                                  auVar145._12_4_ = auVar68._12_4_ * auVar71._12_4_;
                                  auVar69 = vfmadd213ps_fma(auVar89,auVar82,auVar145);
                                  auVar69 = vfmadd213ps_fma(auVar90,(undefined1  [16])aVar81,auVar69
                                                           );
                                  auVar136._0_4_ = auVar72._0_4_ * *(float *)(ray + 0x30);
                                  auVar136._4_4_ = auVar72._4_4_ * *(float *)(ray + 0x34);
                                  auVar136._8_4_ = auVar72._8_4_ * *(float *)(ray + 0x38);
                                  auVar136._12_4_ = auVar72._12_4_ * *(float *)(ray + 0x3c);
                                  auVar124._0_4_ = uVar43 ^ auVar69._0_4_;
                                  auVar124._4_4_ = uVar151 ^ auVar69._4_4_;
                                  auVar124._8_4_ = uVar152 ^ auVar69._8_4_;
                                  auVar124._12_4_ = uVar153 ^ auVar69._12_4_;
                                  auVar146._0_4_ = auVar72._0_4_ * *(float *)(ray + 0x80);
                                  auVar146._4_4_ = auVar72._4_4_ * *(float *)(ray + 0x84);
                                  auVar146._8_4_ = auVar72._8_4_ * *(float *)(ray + 0x88);
                                  auVar146._12_4_ = auVar72._12_4_ * *(float *)(ray + 0x8c);
                                  uVar23 = vcmpps_avx512vl(auVar124,auVar146,2);
                                  uVar24 = vcmpps_avx512vl(auVar136,auVar124,1);
                                  bVar41 = bVar41 & (byte)uVar23 & (byte)uVar24;
                                  if (bVar41 == 0) {
                                    uVar43 = 0;
                                  }
                                  else {
                                    uVar23 = vcmpps_avx512vl(auVar70,ZEXT816(0) << 0x20,4);
                                    bVar41 = bVar41 & (byte)uVar23;
                                    uVar43 = (uint)bVar41;
                                    if (bVar41 != 0) {
                                      in_ZMM22 = ZEXT1664(auVar129);
                                      in_ZMM23 = ZEXT1664(auVar131);
                                      in_ZMM24 = ZEXT1664(auVar72);
                                      local_1a58 = aVar81;
                                      local_1a48 = auVar124;
                                    }
                                  }
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar160 = ZEXT1664(auVar70);
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar161 = ZEXT1664(auVar70);
                                  auVar70 = vxorps_avx512vl(auVar73,auVar73);
                                  auVar162 = ZEXT1664(auVar70);
                                }
                                auVar70 = auVar162._0_16_;
                                bVar41 = (byte)uVar43;
                                if (bVar41 != 0) {
                                  auVar73 = vcvtsi2ss_avx512f(auVar98,*(ushort *)
                                                                       (lVar16 + 8 + lVar48) - 1);
                                  auVar83._4_12_ = auVar162._4_12_;
                                  auVar83._0_4_ = auVar73._0_4_;
                                  auVar69 = vrcp14ss_avx512f(auVar70,auVar83);
                                  auVar73 = vfnmadd213ss_avx512f
                                                      (auVar73,auVar69,
                                                       SUB6416(ZEXT464(0x40000000),0));
                                  fVar122 = auVar69._0_4_ * auVar73._0_4_;
                                  auVar73 = vcvtsi2ss_avx512f(auVar98,*(ushort *)
                                                                       (lVar16 + 10 + lVar48) - 1);
                                  auVar84._4_12_ = auVar83._4_12_;
                                  auVar84._0_4_ = auVar73._0_4_;
                                  auVar69 = vrcp14ss_avx512f(auVar70,auVar84);
                                  auVar73 = vfnmadd213ss_avx512f
                                                      (auVar73,auVar69,
                                                       SUB6416(ZEXT464(0x40000000),0));
                                  fVar7 = auVar69._0_4_ * auVar73._0_4_;
                                  auVar73 = vcvtsi2ss_avx512f(auVar98,((uint)uVar45 & 1) + uVar57);
                                  auVar118._0_4_ = auVar73._0_4_;
                                  auVar118._4_4_ = auVar118._0_4_;
                                  auVar118._8_4_ = auVar118._0_4_;
                                  auVar118._12_4_ = auVar118._0_4_;
                                  auVar69 = in_ZMM24._0_16_;
                                  auVar73 = vmulps_avx512vl(auVar118,auVar69);
                                  auVar73 = vaddps_avx512vl(in_ZMM22._0_16_,auVar73);
                                  auVar100._4_4_ = fVar122;
                                  auVar100._0_4_ = fVar122;
                                  auVar100._8_4_ = fVar122;
                                  auVar100._12_4_ = fVar122;
                                  auVar73 = vmulps_avx512vl(auVar73,auVar100);
                                  auVar85._0_4_ =
                                       (uint)(bVar41 & 1) * auVar73._0_4_ |
                                       (uint)!(bool)(bVar41 & 1) * in_ZMM22._0_4_;
                                  bVar65 = (bool)((byte)(uVar43 >> 1) & 1);
                                  auVar85._4_4_ =
                                       (uint)bVar65 * auVar73._4_4_ | (uint)!bVar65 * in_ZMM22._4_4_
                                  ;
                                  bVar65 = (bool)((byte)(uVar43 >> 2) & 1);
                                  auVar85._8_4_ =
                                       (uint)bVar65 * auVar73._8_4_ | (uint)!bVar65 * in_ZMM22._8_4_
                                  ;
                                  auVar85._12_4_ =
                                       (uVar43 >> 3) * auVar73._12_4_ |
                                       (uint)!SUB41(uVar43 >> 3,0) * in_ZMM22._12_4_;
                                  in_ZMM22 = ZEXT1664(auVar85);
                                  auVar73 = vcvtsi2ss_avx512f(auVar98,((uint)(uVar45 >> 1) &
                                                                      0x7fffffff) + uVar58);
                                  auVar101._0_4_ = auVar73._0_4_;
                                  auVar101._4_4_ = auVar101._0_4_;
                                  auVar101._8_4_ = auVar101._0_4_;
                                  auVar101._12_4_ = auVar101._0_4_;
                                  auVar73 = vmulps_avx512vl(auVar101,auVar69);
                                  auVar73 = vaddps_avx512vl(in_ZMM23._0_16_,auVar73);
                                  auVar110._4_4_ = fVar7;
                                  auVar110._0_4_ = fVar7;
                                  auVar110._8_4_ = fVar7;
                                  auVar110._12_4_ = fVar7;
                                  auVar73 = vmulps_avx512vl(auVar73,auVar110);
                                  auVar86._0_4_ =
                                       (uint)(bVar41 & 1) * auVar73._0_4_ |
                                       (uint)!(bool)(bVar41 & 1) * in_ZMM23._0_4_;
                                  bVar65 = (bool)((byte)(uVar43 >> 1) & 1);
                                  auVar86._4_4_ =
                                       (uint)bVar65 * auVar73._4_4_ | (uint)!bVar65 * in_ZMM23._4_4_
                                  ;
                                  bVar65 = (bool)((byte)(uVar43 >> 2) & 1);
                                  auVar86._8_4_ =
                                       (uint)bVar65 * auVar73._8_4_ | (uint)!bVar65 * in_ZMM23._8_4_
                                  ;
                                  auVar86._12_4_ =
                                       (uVar43 >> 3) * auVar73._12_4_ |
                                       (uint)!SUB41(uVar43 >> 3,0) * in_ZMM23._12_4_;
                                  in_ZMM23 = ZEXT1664(auVar86);
                                  pGVar15 = (context->scene->geometries).items
                                            [(uint)lower_z.field_0.i[uVar45]].ptr;
                                  uVar43 = pGVar15->mask;
                                  auVar102._4_4_ = uVar43;
                                  auVar102._0_4_ = uVar43;
                                  auVar102._8_4_ = uVar43;
                                  auVar102._12_4_ = uVar43;
                                  uVar23 = vptestmd_avx512vl(auVar102,*(undefined1 (*) [16])
                                                                       (ray + 0x90));
                                  bVar41 = (byte)uVar23 & 0xf & bVar41;
                                  uVar54 = (ulong)bVar41;
                                  if (bVar41 != 0) {
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar73 = vrcp14ps_avx512vl(auVar69);
                                      auVar31._8_4_ = 0x3f800000;
                                      auVar31._0_8_ = &DAT_3f8000003f800000;
                                      auVar31._12_4_ = 0x3f800000;
                                      auVar90 = vfnmadd213ps_avx512vl(auVar73,auVar69,auVar31);
                                      auVar73 = vfmadd132ps_fma(auVar90,auVar73,auVar73);
                                      auVar90 = vmulps_avx512vl(auVar85,auVar73);
                                      vmulps_avx512vl(auVar86,auVar73);
                                      vpbroadcastd_avx512vl();
                                      vpbroadcastd_avx512vl();
                                      upper_x.field_0 = local_1a58;
                                      vpcmpeqd_avx2(ZEXT1632(auVar90),ZEXT1632(auVar90));
                                      iVar44 = *(int *)(ray + 0x80);
                                      iVar121 = *(int *)(ray + 0x84);
                                      iVar33 = *(int *)(ray + 0x88);
                                      iVar34 = *(int *)(ray + 0x8c);
                                      auVar73 = vmulps_avx512vl(auVar73,local_1a48);
                                      bVar65 = (bool)(bVar41 >> 1 & 1);
                                      bVar19 = (bool)(bVar41 >> 2 & 1);
                                      *(uint *)(ray + 0x80) =
                                           (uint)(bVar41 & 1) * auVar73._0_4_ |
                                           (uint)!(bool)(bVar41 & 1) * iVar44;
                                      *(uint *)(ray + 0x84) =
                                           (uint)bVar65 * auVar73._4_4_ | (uint)!bVar65 * iVar121;
                                      *(uint *)(ray + 0x88) =
                                           (uint)bVar19 * auVar73._8_4_ | (uint)!bVar19 * iVar33;
                                      *(uint *)(ray + 0x8c) =
                                           (uint)(bVar41 >> 3) * auVar73._12_4_ |
                                           (uint)!(bool)(bVar41 >> 3) * iVar34;
                                      upper_y.field_0 =
                                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                           vpmovm2d_avx512vl((ulong)bVar41);
                                      lower_y.field_0._8_8_ = pGVar15->userPtr;
                                      lower_y.field_0._0_8_ = &upper_y;
                                      auVar73 = vmovdqa64_avx512vl(auVar98);
                                      auVar90 = vmovdqa64_avx512vl(auVar163._0_16_);
                                      if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        (*pGVar15->occlusionFilterN)
                                                  ((RTCFilterFunctionNArguments *)&lower_y);
                                        auVar89 = vmovdqa64_avx512vl(auVar90);
                                        auVar163 = ZEXT1664(auVar89);
                                        auVar89 = vmovdqa64_avx512vl(auVar73);
                                        auVar147 = ZEXT1664(auVar89);
                                        in_ZMM24 = ZEXT1664(auVar69);
                                        auVar70 = vxorps_avx512vl(auVar70,auVar70);
                                        auVar162 = ZEXT1664(auVar70);
                                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar161 = ZEXT1664(auVar70);
                                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar160 = ZEXT1664(auVar70);
                                      }
                                      auVar70 = auVar162._0_16_;
                                      uVar54 = vptestmd_avx512vl((undefined1  [16])upper_y.field_0,
                                                                 (undefined1  [16])upper_y.field_0);
                                      uVar54 = uVar54 & 0xf;
                                      if ((char)uVar54 != '\0') {
                                        p_Var18 = context->args->filter;
                                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*p_Var18)((RTCFilterFunctionNArguments *)&lower_y);
                                          auVar90 = vmovdqa64_avx512vl(auVar90);
                                          auVar163 = ZEXT1664(auVar90);
                                          auVar73 = vmovdqa64_avx512vl(auVar73);
                                          auVar147 = ZEXT1664(auVar73);
                                          in_ZMM24 = ZEXT1664(auVar69);
                                          auVar70 = vxorps_avx512vl(auVar70,auVar70);
                                          auVar162 = ZEXT1664(auVar70);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar161 = ZEXT1664(auVar70);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar160 = ZEXT1664(auVar70);
                                        }
                                        uVar54 = vptestmd_avx512vl((undefined1  [16])upper_y.field_0
                                                                   ,(undefined1  [16])
                                                                    upper_y.field_0);
                                        uVar54 = uVar54 & 0xf;
                                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar65 = (bool)((byte)uVar54 & 1);
                                        bVar19 = (bool)((byte)(uVar54 >> 1) & 1);
                                        bVar20 = (bool)((byte)(uVar54 >> 2) & 1);
                                        bVar21 = SUB81(uVar54 >> 3,0);
                                        *(uint *)(ray + 0x80) =
                                             (uint)bVar65 * auVar70._0_4_ |
                                             (uint)!bVar65 * *(int *)(ray + 0x80);
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar19 * auVar70._4_4_ |
                                             (uint)!bVar19 * *(int *)(ray + 0x84);
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar20 * auVar70._8_4_ |
                                             (uint)!bVar20 * *(int *)(ray + 0x88);
                                        *(uint *)(ray + 0x8c) =
                                             (uint)bVar21 * auVar70._12_4_ |
                                             (uint)!bVar21 * *(int *)(ray + 0x8c);
                                      }
                                      bVar65 = (bool)((byte)uVar54 & 1);
                                      bVar19 = (bool)((byte)(uVar54 >> 1) & 1);
                                      bVar20 = (bool)((byte)(uVar54 >> 2) & 1);
                                      bVar21 = SUB81(uVar54 >> 3,0);
                                      *(uint *)pRVar1 =
                                           (uint)bVar65 * *(int *)pRVar1 | (uint)!bVar65 * iVar44;
                                      *(uint *)(ray + 0x84) =
                                           (uint)bVar19 * *(int *)(ray + 0x84) |
                                           (uint)!bVar19 * iVar121;
                                      *(uint *)(ray + 0x88) =
                                           (uint)bVar20 * *(int *)(ray + 0x88) |
                                           (uint)!bVar20 * iVar33;
                                      *(uint *)(ray + 0x8c) =
                                           (uint)bVar21 * *(int *)(ray + 0x8c) |
                                           (uint)!bVar21 * iVar34;
                                    }
                                    in_ZMM23 = ZEXT1664(auVar86);
                                    in_ZMM22 = ZEXT1664(auVar85);
                                    bVar47 = ((byte)uVar54 ^ 0xf) & bVar47;
                                  }
                                }
                                auVar39._4_4_ = fVar9;
                                auVar39._0_4_ = fVar9;
                                auVar39._8_4_ = fVar9;
                                auVar39._12_4_ = fVar9;
                                auVar71 = vsubps_avx512vl(auVar76,auVar39);
                                auVar38._4_4_ = fVar10;
                                auVar38._0_4_ = fVar10;
                                auVar38._8_4_ = fVar10;
                                auVar38._12_4_ = fVar10;
                                auVar72 = vsubps_avx512vl(auVar77,auVar38);
                                auVar37._4_4_ = fVar11;
                                auVar37._0_4_ = fVar11;
                                auVar37._8_4_ = fVar11;
                                auVar37._12_4_ = fVar11;
                                auVar87 = vsubps_avx512vl(auVar78,auVar37);
                                auVar88 = vsubps_avx512vl(auVar74,auVar76);
                                auVar74 = vsubps_avx512vl(auVar75,auVar77);
                                auVar79 = vsubps_avx512vl(_local_1b28,auVar78);
                                auVar70 = vmulps_avx512vl(auVar72,auVar79);
                                aVar81 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                         vfmsub231ps_fma(auVar70,auVar74,auVar87);
                                auVar111._0_4_ = auVar87._0_4_ * auVar88._0_4_;
                                auVar111._4_4_ = auVar87._4_4_ * auVar88._4_4_;
                                auVar111._8_4_ = auVar87._8_4_ * auVar88._8_4_;
                                auVar111._12_4_ = auVar87._12_4_ * auVar88._12_4_;
                                auVar80 = vfmsub231ps_avx512vl(auVar111,auVar79,auVar71);
                                auVar119._0_4_ = auVar71._0_4_ * auVar74._0_4_;
                                auVar119._4_4_ = auVar71._4_4_ * auVar74._4_4_;
                                auVar119._8_4_ = auVar71._8_4_ * auVar74._8_4_;
                                auVar119._12_4_ = auVar71._12_4_ * auVar74._12_4_;
                                auVar90 = vfmsub231ps_fma(auVar119,auVar88,auVar72);
                                auVar76 = vsubps_avx512vl(auVar76,*(undefined1 (*) [16])ray);
                                auVar77 = vsubps_avx512vl(auVar77,*(undefined1 (*) [16])(ray + 0x10)
                                                         );
                                auVar78 = vsubps_avx512vl(auVar78,*(undefined1 (*) [16])(ray + 0x20)
                                                         );
                                auVar70 = *(undefined1 (*) [16])(ray + 0x40);
                                auVar73 = *(undefined1 (*) [16])(ray + 0x50);
                                auVar69 = *(undefined1 (*) [16])(ray + 0x60);
                                auVar89 = vmulps_avx512vl(auVar73,auVar78);
                                auVar89 = vfmsub231ps_fma(auVar89,auVar77,auVar69);
                                auVar156._0_4_ = auVar69._0_4_ * auVar76._0_4_;
                                auVar156._4_4_ = auVar69._4_4_ * auVar76._4_4_;
                                auVar156._8_4_ = auVar69._8_4_ * auVar76._8_4_;
                                auVar156._12_4_ = auVar69._12_4_ * auVar76._12_4_;
                                auVar68 = vfmsub231ps_fma(auVar156,auVar78,auVar70);
                                auVar158._0_4_ = auVar70._0_4_ * auVar77._0_4_;
                                auVar158._4_4_ = auVar70._4_4_ * auVar77._4_4_;
                                auVar158._8_4_ = auVar70._8_4_ * auVar77._8_4_;
                                auVar158._12_4_ = auVar70._12_4_ * auVar77._12_4_;
                                auVar82 = vfmsub231ps_avx512vl(auVar158,auVar76,auVar73);
                                auVar135._0_4_ = auVar90._0_4_ * auVar69._0_4_;
                                auVar135._4_4_ = auVar90._4_4_ * auVar69._4_4_;
                                auVar135._8_4_ = auVar90._8_4_ * auVar69._8_4_;
                                auVar135._12_4_ = auVar90._12_4_ * auVar69._12_4_;
                                auVar73 = vfmadd231ps_avx512vl(auVar135,auVar80,auVar73);
                                auVar70 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar81,auVar70);
                                auVar73 = vandps_avx512vl(auVar70,auVar161._0_16_);
                                auVar69 = vmulps_avx512vl(auVar79,auVar82);
                                auVar69 = vfmadd231ps_avx512vl(auVar69,auVar68,auVar74);
                                auVar69 = vfmadd231ps_avx512vl(auVar69,auVar89,auVar88);
                                auVar69 = vxorps_avx512vl(auVar73,auVar69);
                                auVar88 = auVar162._0_16_;
                                uVar23 = vcmpps_avx512vl(auVar69,auVar88,5);
                                bVar41 = (byte)uVar23 & bVar47;
                                if (bVar41 == 0) {
LAB_0074ed8c:
                                  uVar43 = 0;
                                }
                                else {
                                  auVar150._0_4_ = auVar87._0_4_ * auVar82._0_4_;
                                  auVar150._4_4_ = auVar87._4_4_ * auVar82._4_4_;
                                  auVar150._8_4_ = auVar87._8_4_ * auVar82._8_4_;
                                  auVar150._12_4_ = auVar87._12_4_ * auVar82._12_4_;
                                  auVar68 = vfmadd213ps_fma(auVar68,auVar72,auVar150);
                                  auVar89 = vfmadd213ps_fma(auVar89,auVar71,auVar68);
                                  auVar144._0_4_ = auVar73._0_4_ ^ auVar89._0_4_;
                                  auVar144._4_4_ = auVar73._4_4_ ^ auVar89._4_4_;
                                  auVar144._8_4_ = auVar73._8_4_ ^ auVar89._8_4_;
                                  auVar144._12_4_ = auVar73._12_4_ ^ auVar89._12_4_;
                                  uVar23 = vcmpps_avx512vl(auVar144,auVar88,5);
                                  bVar41 = bVar41 & (byte)uVar23;
                                  if (bVar41 == 0) goto LAB_0074ed8c;
                                  auVar30._8_4_ = 0x7fffffff;
                                  auVar30._0_8_ = 0x7fffffff7fffffff;
                                  auVar30._12_4_ = 0x7fffffff;
                                  auVar68 = vandps_avx512vl(auVar70,auVar30);
                                  auVar89 = vsubps_avx(auVar68,auVar69);
                                  uVar23 = vcmpps_avx512vl(auVar89,auVar144,5);
                                  bVar41 = bVar41 & (byte)uVar23;
                                  if (bVar41 == 0) goto LAB_0074ed8c;
                                  auVar139._0_4_ = auVar90._0_4_ * auVar78._0_4_;
                                  auVar139._4_4_ = auVar90._4_4_ * auVar78._4_4_;
                                  auVar139._8_4_ = auVar90._8_4_ * auVar78._8_4_;
                                  auVar139._12_4_ = auVar90._12_4_ * auVar78._12_4_;
                                  auVar90 = vfmadd213ps_fma(auVar77,auVar80,auVar139);
                                  auVar90 = vfmadd213ps_fma(auVar76,(undefined1  [16])aVar81,auVar90
                                                           );
                                  auVar132._0_4_ = auVar68._0_4_ * *(float *)(ray + 0x30);
                                  auVar132._4_4_ = auVar68._4_4_ * *(float *)(ray + 0x34);
                                  auVar132._8_4_ = auVar68._8_4_ * *(float *)(ray + 0x38);
                                  auVar132._12_4_ = auVar68._12_4_ * *(float *)(ray + 0x3c);
                                  auVar125._0_4_ = auVar73._0_4_ ^ auVar90._0_4_;
                                  auVar125._4_4_ = auVar73._4_4_ ^ auVar90._4_4_;
                                  auVar125._8_4_ = auVar73._8_4_ ^ auVar90._8_4_;
                                  auVar125._12_4_ = auVar73._12_4_ ^ auVar90._12_4_;
                                  auVar140._0_4_ = auVar68._0_4_ * *(float *)(ray + 0x80);
                                  auVar140._4_4_ = auVar68._4_4_ * *(float *)(ray + 0x84);
                                  auVar140._8_4_ = auVar68._8_4_ * *(float *)(ray + 0x88);
                                  auVar140._12_4_ = auVar68._12_4_ * *(float *)(ray + 0x8c);
                                  uVar23 = vcmpps_avx512vl(auVar125,auVar140,2);
                                  uVar24 = vcmpps_avx512vl(auVar132,auVar125,1);
                                  bVar41 = bVar41 & (byte)uVar23 & (byte)uVar24;
                                  if (bVar41 == 0) {
                                    uVar43 = 0;
                                  }
                                  else {
                                    uVar23 = vcmpps_avx512vl(auVar70,ZEXT816(0) << 0x20,4);
                                    bVar41 = bVar41 & (byte)uVar23;
                                    uVar43 = (uint)bVar41;
                                    if (bVar41 != 0) {
                                      in_ZMM22 = ZEXT1664(auVar69);
                                      in_ZMM23 = ZEXT1664(auVar144);
                                      in_ZMM24 = ZEXT1664(auVar68);
                                      local_1a58 = aVar81;
                                      local_1a48 = auVar125;
                                    }
                                  }
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar160 = ZEXT1664(auVar70);
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar161 = ZEXT1664(auVar70);
                                  auVar70 = vxorps_avx512vl(auVar88,auVar88);
                                  auVar162 = ZEXT1664(auVar70);
                                }
                                auVar70 = auVar162._0_16_;
                                bVar41 = (byte)uVar43;
                                if (bVar41 != 0) {
                                  auVar68 = in_ZMM24._0_16_;
                                  auVar69 = vsubps_avx512vl(auVar68,in_ZMM22._0_16_);
                                  auVar90 = vsubps_avx512vl(auVar68,in_ZMM23._0_16_);
                                  auVar73 = vcvtsi2ss_avx512f(auVar75,*(ushort *)
                                                                       (lVar16 + 8 + lVar48) - 1);
                                  auVar91._4_12_ = auVar162._4_12_;
                                  auVar91._0_4_ = auVar73._0_4_;
                                  auVar89 = vrcp14ss_avx512f(auVar70,auVar91);
                                  auVar73 = vfnmadd213ss_avx512f
                                                      (auVar73,auVar89,
                                                       SUB6416(ZEXT464(0x40000000),0));
                                  fVar122 = auVar89._0_4_ * auVar73._0_4_;
                                  auVar73 = vcvtsi2ss_avx512f(auVar75,*(ushort *)
                                                                       (lVar16 + 10 + lVar48) - 1);
                                  auVar92._4_12_ = auVar91._4_12_;
                                  auVar92._0_4_ = auVar73._0_4_;
                                  auVar89 = vrcp14ss_avx512f(auVar70,auVar92);
                                  auVar73 = vfnmadd213ss_avx512f
                                                      (auVar73,auVar89,
                                                       SUB6416(ZEXT464(0x40000000),0));
                                  fVar7 = auVar89._0_4_ * auVar73._0_4_;
                                  auVar73 = vcvtsi2ss_avx512f(auVar75,((uint)uVar45 & 1) + uVar57);
                                  auVar120._0_4_ = auVar73._0_4_;
                                  auVar120._4_4_ = auVar120._0_4_;
                                  auVar120._8_4_ = auVar120._0_4_;
                                  auVar120._12_4_ = auVar120._0_4_;
                                  auVar73 = vmulps_avx512vl(auVar120,auVar68);
                                  auVar73 = vaddps_avx512vl(auVar69,auVar73);
                                  auVar103._4_4_ = fVar122;
                                  auVar103._0_4_ = fVar122;
                                  auVar103._8_4_ = fVar122;
                                  auVar103._12_4_ = fVar122;
                                  auVar73 = vmulps_avx512vl(auVar73,auVar103);
                                  auVar93._0_4_ =
                                       (uint)(bVar41 & 1) * auVar73._0_4_ |
                                       (uint)!(bool)(bVar41 & 1) * auVar69._0_4_;
                                  bVar65 = (bool)((byte)(uVar43 >> 1) & 1);
                                  auVar93._4_4_ =
                                       (uint)bVar65 * auVar73._4_4_ | (uint)!bVar65 * auVar69._4_4_;
                                  bVar65 = (bool)((byte)(uVar43 >> 2) & 1);
                                  auVar93._8_4_ =
                                       (uint)bVar65 * auVar73._8_4_ | (uint)!bVar65 * auVar69._8_4_;
                                  auVar93._12_4_ =
                                       (uVar43 >> 3) * auVar73._12_4_ |
                                       (uint)!SUB41(uVar43 >> 3,0) * auVar69._12_4_;
                                  in_ZMM22 = ZEXT1664(auVar93);
                                  auVar73 = vcvtsi2ss_avx512f(auVar75,((uint)(uVar45 >> 1) &
                                                                      0x7fffffff) + uVar58);
                                  auVar104._0_4_ = auVar73._0_4_;
                                  auVar104._4_4_ = auVar104._0_4_;
                                  auVar104._8_4_ = auVar104._0_4_;
                                  auVar104._12_4_ = auVar104._0_4_;
                                  auVar73 = vmulps_avx512vl(auVar104,auVar68);
                                  auVar73 = vaddps_avx512vl(auVar90,auVar73);
                                  auVar112._4_4_ = fVar7;
                                  auVar112._0_4_ = fVar7;
                                  auVar112._8_4_ = fVar7;
                                  auVar112._12_4_ = fVar7;
                                  auVar73 = vmulps_avx512vl(auVar73,auVar112);
                                  auVar94._0_4_ =
                                       (uint)(bVar41 & 1) * auVar73._0_4_ |
                                       (uint)!(bool)(bVar41 & 1) * auVar90._0_4_;
                                  bVar65 = (bool)((byte)(uVar43 >> 1) & 1);
                                  auVar94._4_4_ =
                                       (uint)bVar65 * auVar73._4_4_ | (uint)!bVar65 * auVar90._4_4_;
                                  bVar65 = (bool)((byte)(uVar43 >> 2) & 1);
                                  auVar94._8_4_ =
                                       (uint)bVar65 * auVar73._8_4_ | (uint)!bVar65 * auVar90._8_4_;
                                  auVar94._12_4_ =
                                       (uVar43 >> 3) * auVar73._12_4_ |
                                       (uint)!SUB41(uVar43 >> 3,0) * auVar90._12_4_;
                                  in_ZMM23 = ZEXT1664(auVar94);
                                  pGVar15 = (context->scene->geometries).items
                                            [(uint)lower_z.field_0.i[uVar45]].ptr;
                                  uVar43 = pGVar15->mask;
                                  auVar105._4_4_ = uVar43;
                                  auVar105._0_4_ = uVar43;
                                  auVar105._8_4_ = uVar43;
                                  auVar105._12_4_ = uVar43;
                                  uVar23 = vptestmd_avx512vl(auVar105,*(undefined1 (*) [16])
                                                                       (ray + 0x90));
                                  bVar41 = (byte)uVar23 & 0xf & bVar41;
                                  uVar54 = (ulong)bVar41;
                                  if (bVar41 != 0) {
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar73 = vrcp14ps_avx512vl(auVar68);
                                      auVar29._8_4_ = 0x3f800000;
                                      auVar29._0_8_ = &DAT_3f8000003f800000;
                                      auVar29._12_4_ = 0x3f800000;
                                      auVar69 = vfnmadd213ps_avx512vl(auVar73,auVar68,auVar29);
                                      auVar73 = vfmadd132ps_fma(auVar69,auVar73,auVar73);
                                      auVar69 = vmulps_avx512vl(auVar93,auVar73);
                                      vmulps_avx512vl(auVar94,auVar73);
                                      vpbroadcastd_avx512vl();
                                      vpbroadcastd_avx512vl();
                                      upper_x.field_0 = local_1a58;
                                      vpcmpeqd_avx2(ZEXT1632(auVar69),ZEXT1632(auVar69));
                                      iVar44 = *(int *)(ray + 0x80);
                                      iVar121 = *(int *)(ray + 0x84);
                                      fVar122 = *(float *)(ray + 0x88);
                                      auVar40 = *(undefined1 (*) [12])(ray + 0x80);
                                      iVar33 = *(int *)(ray + 0x8c);
                                      auVar73 = vmulps_avx512vl(auVar73,local_1a48);
                                      bVar65 = (bool)(bVar41 >> 1 & 1);
                                      bVar19 = (bool)(bVar41 >> 2 & 1);
                                      *(uint *)(ray + 0x80) =
                                           (uint)(bVar41 & 1) * auVar73._0_4_ |
                                           (uint)!(bool)(bVar41 & 1) * iVar44;
                                      *(uint *)(ray + 0x84) =
                                           (uint)bVar65 * auVar73._4_4_ | (uint)!bVar65 * iVar121;
                                      *(uint *)(ray + 0x88) =
                                           (uint)bVar19 * auVar73._8_4_ |
                                           (uint)!bVar19 * (int)fVar122;
                                      *(uint *)(ray + 0x8c) =
                                           (uint)(bVar41 >> 3) * auVar73._12_4_ |
                                           (uint)!(bool)(bVar41 >> 3) * iVar33;
                                      upper_y.field_0 =
                                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                           vpmovm2d_avx512vl((ulong)bVar41);
                                      lower_y.field_0._8_8_ = pGVar15->userPtr;
                                      lower_y.field_0._0_8_ = &upper_y;
                                      auVar73 = vmovdqa64_avx512vl(auVar147._0_16_);
                                      auVar69 = vmovdqa64_avx512vl(auVar163._0_16_);
                                      local_1b28._0_4_ = auVar40._0_4_;
                                      local_1b28._4_4_ = auVar40._4_4_;
                                      fStack_1b20 = auVar40._8_4_;
                                      if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        (*pGVar15->occlusionFilterN)
                                                  ((RTCFilterFunctionNArguments *)&lower_y);
                                        auVar90 = vmovdqa64_avx512vl(auVar69);
                                        auVar163 = ZEXT1664(auVar90);
                                        auVar90 = vmovdqa64_avx512vl(auVar73);
                                        auVar147 = ZEXT1664(auVar90);
                                        in_ZMM24 = ZEXT1664(auVar68);
                                        auVar70 = vxorps_avx512vl(auVar70,auVar70);
                                        auVar162 = ZEXT1664(auVar70);
                                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar161 = ZEXT1664(auVar70);
                                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar160 = ZEXT1664(auVar70);
                                        iVar44 = local_1b28._0_4_;
                                        iVar121 = local_1b28._4_4_;
                                        fVar122 = fStack_1b20;
                                      }
                                      auVar70 = auVar162._0_16_;
                                      uVar54 = vptestmd_avx512vl((undefined1  [16])upper_y.field_0,
                                                                 (undefined1  [16])upper_y.field_0);
                                      uVar54 = uVar54 & 0xf;
                                      if ((char)uVar54 != '\0') {
                                        p_Var18 = context->args->filter;
                                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*p_Var18)((RTCFilterFunctionNArguments *)&lower_y);
                                          auVar69 = vmovdqa64_avx512vl(auVar69);
                                          auVar163 = ZEXT1664(auVar69);
                                          auVar73 = vmovdqa64_avx512vl(auVar73);
                                          auVar147 = ZEXT1664(auVar73);
                                          in_ZMM24 = ZEXT1664(auVar68);
                                          auVar70 = vxorps_avx512vl(auVar70,auVar70);
                                          auVar162 = ZEXT1664(auVar70);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar161 = ZEXT1664(auVar70);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar160 = ZEXT1664(auVar70);
                                          iVar44 = local_1b28._0_4_;
                                          iVar121 = local_1b28._4_4_;
                                          fVar122 = fStack_1b20;
                                        }
                                        uVar54 = vptestmd_avx512vl((undefined1  [16])upper_y.field_0
                                                                   ,(undefined1  [16])
                                                                    upper_y.field_0);
                                        uVar54 = uVar54 & 0xf;
                                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar65 = (bool)((byte)uVar54 & 1);
                                        auVar95._0_4_ =
                                             (uint)bVar65 * auVar70._0_4_ |
                                             (uint)!bVar65 * *(int *)(ray + 0x80);
                                        bVar65 = (bool)((byte)(uVar54 >> 1) & 1);
                                        auVar95._4_4_ =
                                             (uint)bVar65 * auVar70._4_4_ |
                                             (uint)!bVar65 * *(int *)(ray + 0x84);
                                        bVar65 = (bool)((byte)(uVar54 >> 2) & 1);
                                        auVar95._8_4_ =
                                             (uint)bVar65 * auVar70._8_4_ |
                                             (uint)!bVar65 * *(int *)(ray + 0x88);
                                        bVar65 = SUB81(uVar54 >> 3,0);
                                        auVar95._12_4_ =
                                             (uint)bVar65 * auVar70._12_4_ |
                                             (uint)!bVar65 * *(int *)(ray + 0x8c);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar95;
                                      }
                                      bVar65 = (bool)((byte)uVar54 & 1);
                                      auVar96._0_4_ =
                                           (uint)bVar65 * *(int *)pRVar1 | (uint)!bVar65 * iVar44;
                                      bVar65 = (bool)((byte)(uVar54 >> 1) & 1);
                                      auVar96._4_4_ =
                                           (uint)bVar65 * *(int *)(ray + 0x84) |
                                           (uint)!bVar65 * iVar121;
                                      bVar65 = (bool)((byte)(uVar54 >> 2) & 1);
                                      auVar96._8_4_ =
                                           (uint)bVar65 * *(int *)(ray + 0x88) |
                                           (uint)!bVar65 * (int)fVar122;
                                      bVar65 = SUB81(uVar54 >> 3,0);
                                      auVar96._12_4_ =
                                           (uint)bVar65 * *(int *)(ray + 0x8c) |
                                           (uint)!bVar65 * iVar33;
                                      *(undefined1 (*) [16])pRVar1 = auVar96;
                                    }
                                    in_ZMM23 = ZEXT1664(auVar94);
                                    in_ZMM22 = ZEXT1664(auVar93);
                                    bVar47 = ((byte)uVar54 ^ 0xf) & bVar47;
                                  }
                                }
                                if (bVar47 == 0) break;
                                pfVar64 = pfVar64 + 0x10;
                                bVar65 = uVar45 < 3;
                                uVar45 = uVar45 + 1;
                              } while (bVar65);
                              bVar55 = bVar55 & bVar47;
                              bVar65 = bVar55 == 0;
                            }
                          } while ((!bVar65) && (uVar52 = uVar52 - 1 & uVar52, uVar52 != 0));
                        }
                        lVar46 = lVar46 + 1;
                      } while (lVar46 != uVar66 - 8);
                      bVar55 = ~bVar55 & 0xf;
                    }
                    bVar55 = (byte)uVar63 | bVar55;
                    uVar63 = (ushort)bVar55;
                    if (bVar55 == 0xf) goto LAB_0074f7d1;
                    auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    tray.tfar.field_0.i[0] =
                         (uint)(bVar55 & 1) * auVar70._0_4_ |
                         (uint)!(bool)(bVar55 & 1) * tray.tfar.field_0.i[0];
                    bVar65 = (bool)(bVar55 >> 1 & 1);
                    tray.tfar.field_0.i[1] =
                         (uint)bVar65 * auVar70._4_4_ | (uint)!bVar65 * tray.tfar.field_0.i[1];
                    bVar65 = (bool)(bVar55 >> 2 & 1);
                    tray.tfar.field_0.i[2] =
                         (uint)bVar65 * auVar70._8_4_ | (uint)!bVar65 * tray.tfar.field_0.i[2];
                    bVar65 = (bool)(bVar55 >> 3 & 1);
                    tray.tfar.field_0.i[3] =
                         (uint)bVar65 * auVar70._12_4_ | (uint)!bVar65 * tray.tfar.field_0.i[3];
                    iVar44 = 0;
                    break;
                  }
                  goto LAB_0074f806;
                }
                auVar147 = ZEXT1664(auVar160._0_16_);
                uVar66 = 0;
                sVar51 = 8;
                do {
                  sVar14 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + uVar66 * 8);
                  if (sVar14 != 8) {
                    auVar35._4_4_ = tray.org_rdir.field_0._4_4_;
                    auVar35._0_4_ = tray.org_rdir.field_0._0_4_;
                    auVar35._8_4_ = tray.org_rdir.field_0._8_4_;
                    auVar35._12_4_ = tray.org_rdir.field_0._12_4_;
                    uVar61 = *(undefined4 *)(root.ptr + 0x20 + uVar66 * 4);
                    auVar126._4_4_ = uVar61;
                    auVar126._0_4_ = uVar61;
                    auVar126._8_4_ = uVar61;
                    auVar126._12_4_ = uVar61;
                    auVar69 = vfmsub132ps_fma(auVar126,auVar35,
                                              (undefined1  [16])tray.rdir.field_0.field_0.x.field_0)
                    ;
                    uVar61 = *(undefined4 *)(root.ptr + 0x40 + uVar66 * 4);
                    auVar133._4_4_ = uVar61;
                    auVar133._0_4_ = uVar61;
                    auVar133._8_4_ = uVar61;
                    auVar133._12_4_ = uVar61;
                    auVar36._4_4_ = tray.org_rdir.field_0._36_4_;
                    auVar36._0_4_ = tray.org_rdir.field_0._32_4_;
                    auVar36._8_4_ = tray.org_rdir.field_0._40_4_;
                    auVar36._12_4_ = tray.org_rdir.field_0._44_4_;
                    uVar61 = *(undefined4 *)(root.ptr + 0x60 + uVar66 * 4);
                    auVar141._4_4_ = uVar61;
                    auVar141._0_4_ = uVar61;
                    auVar141._8_4_ = uVar61;
                    auVar141._12_4_ = uVar61;
                    auVar90 = vfmsub132ps_fma(auVar133,(undefined1  [16])
                                                       tray.org_rdir.field_0.field_0.y.field_0,
                                              (undefined1  [16])tray.rdir.field_0.field_0.y.field_0)
                    ;
                    auVar89 = vfmsub132ps_fma(auVar141,auVar36,
                                              (undefined1  [16])tray.rdir.field_0.field_0.z.field_0)
                    ;
                    uVar61 = *(undefined4 *)(root.ptr + 0x30 + uVar66 * 4);
                    auVar26._4_4_ = uVar61;
                    auVar26._0_4_ = uVar61;
                    auVar26._8_4_ = uVar61;
                    auVar26._12_4_ = uVar61;
                    auVar68 = vfmsub132ps_avx512vl
                                        ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                         auVar35,auVar26);
                    uVar61 = *(undefined4 *)(root.ptr + 0x50 + uVar66 * 4);
                    auVar27._4_4_ = uVar61;
                    auVar27._0_4_ = uVar61;
                    auVar27._8_4_ = uVar61;
                    auVar27._12_4_ = uVar61;
                    auVar71 = vfmsub132ps_avx512vl
                                        ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                         (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,
                                         auVar27);
                    uVar61 = *(undefined4 *)(root.ptr + 0x70 + uVar66 * 4);
                    auVar28._4_4_ = uVar61;
                    auVar28._0_4_ = uVar61;
                    auVar28._8_4_ = uVar61;
                    auVar28._12_4_ = uVar61;
                    auVar72 = vfmsub132ps_avx512vl
                                        ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,
                                         auVar36,auVar28);
                    auVar70 = vpminsd_avx(auVar69,auVar68);
                    auVar73 = vpminsd_avx(auVar90,auVar71);
                    auVar70 = vpmaxsd_avx(auVar70,auVar73);
                    auVar73 = vpminsd_avx(auVar89,auVar72);
                    auVar70 = vpmaxsd_avx(auVar70,auVar73);
                    auVar73 = vpmaxsd_avx(auVar69,auVar68);
                    auVar69 = vpmaxsd_avx(auVar90,auVar71);
                    auVar69 = vpminsd_avx(auVar73,auVar69);
                    auVar73 = vpmaxsd_avx(auVar89,auVar72);
                    auVar69 = vpminsd_avx(auVar69,auVar73);
                    auVar73 = vpmaxsd_avx(auVar70,(undefined1  [16])tray.tnear.field_0);
                    auVar69 = vpminsd_avx(auVar69,(undefined1  [16])tray.tfar.field_0);
                    uVar67 = vpcmpd_avx512vl(auVar73,auVar69,2);
                    uVar67 = uVar67 & 0xf;
                    if ((byte)uVar67 != 0) {
                      auVar73 = vblendmps_avx512vl(auVar160._0_16_,auVar70);
                      bVar65 = (bool)((byte)uVar67 & 1);
                      bVar19 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar20 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar21 = SUB81(uVar67 >> 3,0);
                      if (sVar51 != 8) {
                        pNVar59->ptr = sVar51;
                        pNVar59 = pNVar59 + 1;
                        *paVar60 = auVar147._0_16_;
                        paVar60 = paVar60 + 1;
                      }
                      auVar147 = ZEXT1664(CONCAT412((uint)bVar21 * auVar73._12_4_ |
                                                    (uint)!bVar21 * auVar70._12_4_,
                                                    CONCAT48((uint)bVar20 * auVar73._8_4_ |
                                                             (uint)!bVar20 * auVar70._8_4_,
                                                             CONCAT44((uint)bVar19 * auVar73._4_4_ |
                                                                      (uint)!bVar19 * auVar70._4_4_,
                                                                      (uint)bVar65 * auVar73._0_4_ |
                                                                      (uint)!bVar65 * auVar70._0_4_)
                                                            )));
                      sVar51 = sVar14;
                    }
                  }
                } while ((sVar14 != 8) && (bVar65 = uVar66 < 3, uVar66 = uVar66 + 1, bVar65));
                iVar44 = 0;
                if (sVar51 == 8) {
LAB_0074e62c:
                  bVar65 = false;
                  iVar44 = 4;
                }
                else {
                  uVar23 = vcmpps_avx512vl((undefined1  [16])auVar147._0_16_,
                                           (undefined1  [16])tray.tfar.field_0,9);
                  bVar65 = true;
                  if ((uint)POPCOUNT((int)uVar23) <= uVar53) {
                    pNVar59->ptr = sVar51;
                    pNVar59 = pNVar59 + 1;
                    *paVar60 = auVar147._0_16_;
                    paVar60 = paVar60 + 1;
                    goto LAB_0074e62c;
                  }
                }
                root.ptr = sVar51;
              } while (bVar65);
            }
          }
        }
      } while (iVar44 != 3);
      bVar42 = (byte)uVar63 & bVar42;
      bVar65 = (bool)(bVar42 >> 1 & 1);
      bVar19 = (bool)(bVar42 >> 2 & 1);
      *(uint *)pRVar1 = (uint)(bVar42 & 1) * -0x800000 | (uint)!(bool)(bVar42 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar65 * -0x800000 | (uint)!bVar65 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar19 * -0x800000 | (uint)!bVar19 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar42 >> 3) * -0x800000 | (uint)!(bool)(bVar42 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }